

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boolean.c
# Opt level: O0

int lyplg_type_sort_boolean(ly_ctx *UNUSED_ctx,lyd_value *val1,lyd_value *val2)

{
  lyd_value *val2_local;
  lyd_value *val1_local;
  ly_ctx *UNUSED_ctx_local;
  
  if ((val2->field_2).boolean < (val1->field_2).boolean) {
    UNUSED_ctx_local._4_4_ = 1;
  }
  else if ((val1->field_2).boolean < (val2->field_2).boolean) {
    UNUSED_ctx_local._4_4_ = -1;
  }
  else {
    UNUSED_ctx_local._4_4_ = 0;
  }
  return UNUSED_ctx_local._4_4_;
}

Assistant:

LIBYANG_API_DEF int
lyplg_type_sort_boolean(const struct ly_ctx *UNUSED(ctx), const struct lyd_value *val1, const struct lyd_value *val2)
{
    if (val1->boolean > val2->boolean) {
        return 1;
    } else if (val1->boolean < val2->boolean) {
        return -1;
    } else {
        return 0;
    }
}